

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLKinematicsIntermediateData.h
# Opt level: O2

void __thiscall
COLLADASaxFWL::KinematicAttachment::addTransformation
          (KinematicAttachment *this,Transformation *transformation)

{
  Transformation *local_8;
  
  local_8 = transformation;
  std::vector<COLLADAFW::Transformation_*,_std::allocator<COLLADAFW::Transformation_*>_>::push_back
            (&this->mTransformations,&local_8);
  return;
}

Assistant:

void addTransformation( COLLADAFW::Transformation* transformation ) { mTransformations.push_back(transformation); }